

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::SubjectFactory::FX::FXBase::SetupMandatoryFields(FXBase *this)

{
  FXBase *this_local;
  
  MandatoryFieldsSubjectCreator::AddMandatoryKey
            (&this->outer_class_->super_MandatoryFieldsSubjectCreator,
             (string *)SubjectKey::BUY_SIDE_ACCOUNT_abi_cxx11_);
  MandatoryFieldsSubjectCreator::AddMandatoryKey
            (&this->outer_class_->super_MandatoryFieldsSubjectCreator,
             (string *)SubjectKey::CURRENCY_abi_cxx11_);
  MandatoryFieldsSubjectCreator::AddMandatoryKey
            (&this->outer_class_->super_MandatoryFieldsSubjectCreator,
             (string *)SubjectKey::CURRENCY_PAIR_abi_cxx11_);
  MandatoryFieldsSubjectCreator::AddMandatoryKey
            (&this->outer_class_->super_MandatoryFieldsSubjectCreator,
             (string *)SubjectKey::DEAL_TYPE_abi_cxx11_);
  MandatoryFieldsSubjectCreator::AddMandatoryKey
            (&this->outer_class_->super_MandatoryFieldsSubjectCreator,
             (string *)SubjectKey::QUANTITY_abi_cxx11_);
  MandatoryFieldsSubjectCreator::AddMandatoryKey
            (&this->outer_class_->super_MandatoryFieldsSubjectCreator,
             (string *)SubjectKey::LIQUIDITY_PROVIDER_abi_cxx11_);
  return;
}

Assistant:

void SubjectFactory::FX::FXBase::FXBase::SetupMandatoryFields()
{
    outer_class_.AddMandatoryKey(SubjectKey::BUY_SIDE_ACCOUNT);
    outer_class_.AddMandatoryKey(SubjectKey::CURRENCY);
    outer_class_.AddMandatoryKey(SubjectKey::CURRENCY_PAIR);
    outer_class_.AddMandatoryKey(SubjectKey::DEAL_TYPE);
    outer_class_.AddMandatoryKey(SubjectKey::QUANTITY);
    outer_class_.AddMandatoryKey(SubjectKey::LIQUIDITY_PROVIDER);
}